

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SColor.h
# Opt level: O0

SColor __thiscall irr::video::SColor::getInterpolated(SColor *this,SColor *other,f32 d)

{
  u32 a;
  u32 r;
  u32 g;
  u32 b;
  SColor *in_RSI;
  SColor *in_RDI;
  f32 inv;
  float *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SColor local_4;
  
  core::clamp<float>((float *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98,(float *)0x3cc152);
  getAlpha(in_RSI);
  getAlpha(in_RDI);
  a = core::round32(0.0);
  getRed(in_RSI);
  getRed(in_RDI);
  r = core::round32(0.0);
  getGreen(in_RSI);
  getGreen(in_RDI);
  g = core::round32(0.0);
  getBlue(in_RSI);
  getBlue(in_RDI);
  b = core::round32(0.0);
  SColor(&local_4,a,r,g,b);
  return (SColor)local_4.color;
}

Assistant:

SColor getInterpolated(const SColor &other, f32 d) const
	{
		d = core::clamp(d, 0.f, 1.f);
		const f32 inv = 1.0f - d;
		return SColor((u32)core::round32(other.getAlpha() * inv + getAlpha() * d),
				(u32)core::round32(other.getRed() * inv + getRed() * d),
				(u32)core::round32(other.getGreen() * inv + getGreen() * d),
				(u32)core::round32(other.getBlue() * inv + getBlue() * d));
	}